

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void parse_input_keymap(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  wchar_t *pwVar6;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  wchar_t line [32];
  wchar_t func_string [32];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  wchar_t local_138 [32];
  wchar_t local_b8 [34];
  
  memset(char_keys,0,0xc4);
  memset(shift_keys,0,0xc4);
  memset(altgr_keys,0,0xc4);
  _stdin = freopen(args.keymap._M_dataplus._M_p,"r",_stdin);
  if (_stdin == (FILE *)0x0) {
    piVar5 = __errno_location();
    error(1,*piVar5,"Error opening input keymap \'%s\'",args.keymap._M_dataplus._M_p);
  }
  iVar2 = feof(_stdin);
  if (iVar2 == 0) {
    lVar10 = 0;
    iVar2 = -1;
    uVar11 = 0;
    do {
      uVar9 = (uint)lVar10;
      if (0x80 < uVar9) break;
      cVar1 = "_fccccccccccccffccccccccccccffccccccccccccfcccccccccccffffffffffffffffffffffffffffff__cff_______ffffffffffffffff_______f_____fff"
              [lVar10];
      if (cVar1 != '_') {
        uVar11 = uVar11 + 1;
        pwVar6 = fgetws(local_138,0x80,_stdin);
        if (pwVar6 == (wchar_t *)0x0) {
          iVar3 = feof(_stdin);
          if (iVar3 != 0) break;
          piVar5 = __errno_location();
          error_at_line(1,*piVar5,args.keymap._M_dataplus._M_p,uVar11,"fgets() error");
        }
        sVar7 = wcslen(local_138);
        if (8 < sVar7) {
          error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar11,"Line too long!");
        }
        local_158[0] = local_148;
        sVar7 = wcslen(local_138);
        std::__cxx11::wstring::_M_construct<wchar_t_const*>
                  ((wstring *)local_158,local_138,local_138 + sVar7);
        lVar8 = std::__cxx11::wstring::find_last_not_of
                          ((wchar_t *)local_158,0x109b10,0xffffffffffffffff);
        if (local_158[0] != local_148) {
          operator_delete(local_158[0]);
        }
        if (lVar8 == -1) {
          error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar11,"No characters on line");
        }
        local_138[lVar8 + 1] = L'\0';
        if (cVar1 == 'f') {
          if (uVar9 != 0x39) {
            iVar3 = __isoc99_swscanf(local_138,L"%7ls",local_b8);
            if (iVar3 != 1) {
              error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar11,"Invalid function key string");
            }
            iVar3 = 0;
            if (uVar9 != 1) {
              if (((byte)lVar10 & 0xfe) == 0x1c) {
                iVar3 = uVar9 - 0x19;
              }
              else if ((uVar9 & 0xfe) == 0xe) {
                iVar3 = iVar2 + -0xc;
              }
              else {
                iVar3 = 5;
                if (uVar9 != 0x2a) {
                  if (uVar9 - 0x36 < 0x1e) {
                    iVar3 = iVar2 + -0x2f;
                  }
                  else if ((uVar9 - 1 & 0xfffffffe) == 0x56) {
                    iVar3 = iVar2 + -0x32;
                  }
                  else if ((uVar9 & 0xf0) == 0x60) {
                    iVar3 = iVar2 + -0x39;
                  }
                  else {
                    iVar3 = 0x36;
                    if ((uVar9 != 0x77) && (iVar3 = uVar9 - 0x46, 2 < uVar9 - 0x7d)) {
                      iVar3 = -1;
                    }
                  }
                }
              }
            }
            wcscpy(func_keys[iVar3],local_b8);
          }
        }
        else if (cVar1 == 'c') {
          uVar4 = uVar9 - 2;
          if (0xb < uVar4) {
            if (uVar9 - 0x10 < 0xc) {
              uVar4 = iVar2 - 3;
            }
            else if (uVar9 - 0x1e < 0xc) {
              uVar4 = iVar2 - 5;
            }
            else if (uVar9 - 0x2b < 0xb) {
              uVar4 = iVar2 - 6;
            }
            else {
              uVar4 = -(uint)(uVar9 != 0x56) | 0x2f;
            }
          }
          iVar3 = __isoc99_swscanf(local_138,L"%lc %lc %lc",char_keys + uVar4,shift_keys + uVar4,
                                   altgr_keys + uVar4);
          if (iVar3 < 1) {
            error_at_line(1,0,args.keymap._M_dataplus._M_p,uVar11,"Too few input characters on line"
                         );
          }
        }
      }
      iVar3 = feof(_stdin);
      lVar10 = lVar10 + 1;
      iVar2 = iVar2 + 1;
    } while (iVar3 == 0);
    fclose(_stdin);
    if (0x69 < uVar11) {
      return;
    }
  }
  else {
    fclose(_stdin);
  }
  error(1,0,"Too few lines in input keymap \'%s\'; There should be N_KEYS_DEFINED lines!",
        args.keymap._M_dataplus._M_p);
  return;
}

Assistant:

void parse_input_keymap()
{
    // custom map will be used; erase existing US keytables
    memset(char_keys,  '\0', sizeof(char_keys));
    memset(shift_keys, '\0', sizeof(shift_keys));
    memset(altgr_keys, '\0', sizeof(altgr_keys));

    stdin = freopen(args.keymap.c_str(), "r", stdin);
    if (stdin == NULL)
        error(EXIT_FAILURE, errno, "Error opening input keymap '%s'", args.keymap.c_str());

    unsigned int i = -1;
    unsigned int line_number = 0;
    wchar_t func_string[32];
    wchar_t line[32];

    while (!feof(stdin)) {

        if (++i >= sizeof(char_or_func)) break;                         // only ever read up to 128 keycode bindings (currently N_KEYS_DEFINED are used)

        if (is_used_key(i)) {
            ++line_number;
            if(fgetws(line, sizeof(line), stdin) == NULL) {
                if (feof(stdin)) break;
                else error_at_line(EXIT_FAILURE, errno, args.keymap.c_str(), line_number, "fgets() error");
            }
            // line at most 8 characters wide (func lines are "1234567\n", char lines are "1 2 3\n")
            if (wcslen(line) > 8)                                     // TODO: replace 8*2 with 8 and wcslen()!
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Line too long!");
            // terminate line before any \r or \n
            std::wstring::size_type last = std::wstring(line).find_last_not_of(L"\r\n");
            if (last == std::wstring::npos)
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "No characters on line");
            line[last + 1] = '\0';
        }

        if (is_char_key(i)) {
            unsigned int index = to_char_keys_index(i);
            if (swscanf(line, L"%lc %lc %lc", &char_keys[index], &shift_keys[index], &altgr_keys[index]) < 1) {
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Too few input characters on line");
            }
        }
        if (is_func_key(i)) {
            if (i == KEY_SPACE) continue;                                     // space causes empty string and trouble
            if (swscanf(line, L"%7ls", &func_string[0]) != 1)
                error_at_line(EXIT_FAILURE, 0, args.keymap.c_str(), line_number, "Invalid function key string");                                                 // does this ever happen?
            wcscpy(func_keys[to_func_keys_index(i)], func_string);
        }
    }             // while (!feof(stdin))
    fclose(stdin);

    if (line_number < N_KEYS_DEFINED)
#define QUOTE(x) #x  // quotes x so it can be used as (char*)
        error(EXIT_FAILURE, 0, "Too few lines in input keymap '%s'; There should be " QUOTE(N_KEYS_DEFINED) " lines!", args.keymap.c_str());
}